

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O2

jas_image_t * makediffimage(jas_matrix_t *origdata,jas_matrix_t *recondata)

{
  long lVar1;
  long lVar2;
  undefined1 __size [8];
  int iVar3;
  long lVar4;
  jas_image_t *pjVar5;
  jas_matrix_t *pjVar6;
  long lVar7;
  char *__ptr;
  long lVar8;
  jas_matind_t k;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auStack_110 [8];
  undefined1 local_108 [12];
  undefined1 auStack_fc [4];
  jas_matrix_t *diffdata [3];
  undefined1 auStack_dc [4];
  jas_image_cmptparm_t compparms [3];
  
  lVar1 = origdata->numrows_;
  lVar2 = origdata->numcols_;
  for (lVar4 = 0x34; lVar4 != 0xdc; lVar4 = lVar4 + 0x38) {
    *(undefined8 *)(auStack_110 + lVar4 + 4) = 0;
    *(undefined8 *)(local_108 + lVar4 + 4) = 0;
    *(undefined8 *)(auStack_fc + lVar4) = 1;
    *(undefined8 *)((long)diffdata + lVar4 + 4) = 1;
    *(long *)((long)diffdata + lVar4 + 0xc) = lVar2;
    *(long *)((long)diffdata + lVar4 + 0x14) = lVar1;
    *(undefined8 *)(auStack_dc + lVar4) = 8;
  }
  auStack_110 = (undefined1  [8])0x102941;
  pjVar5 = (jas_image_t *)jas_image_create(3,compparms,0x401);
  if (pjVar5 == (jas_image_t *)0x0) {
    auStack_110 = (undefined1  [8])0x102aa8;
    fwrite("cannot create image\n",0x14,1,_stderr);
    return (jas_image_t *)0x0;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 3) {
      lVar7 = 0;
      lVar4 = 0;
      if (0 < lVar2) {
        lVar4 = lVar2;
      }
      lVar8 = 0;
      if (0 < lVar1) {
        lVar8 = lVar1;
      }
      for (; lVar7 != lVar8; lVar7 = lVar7 + 1) {
        for (lVar9 = 0; lVar4 != lVar9; lVar9 = lVar9 + 1) {
          lVar10 = origdata->rows_[lVar7][lVar9];
          if (recondata->rows_[lVar7][lVar9] < lVar10) {
            diffdata[0]->rows_[lVar7][lVar9] = 0xff;
            lVar10 = 0;
LAB_00102a05:
            lVar11 = 0;
          }
          else {
            if (lVar10 < recondata->rows_[lVar7][lVar9]) {
              diffdata[0]->rows_[lVar7][lVar9] = 0;
              lVar10 = 0xff;
              goto LAB_00102a05;
            }
            diffdata[0]->rows_[lVar7][lVar9] = lVar10;
            lVar11 = lVar10;
          }
          diffdata[1]->rows_[lVar7][lVar9] = lVar10;
          diffdata[2]->rows_[lVar7][lVar9] = lVar11;
        }
      }
      uVar12 = 0;
      do {
        if (uVar12 == 3) {
          return pjVar5;
        }
        local_108._0_8_ = diffdata[uVar12];
        auStack_110 = (undefined1  [8])0x102a5f;
        iVar3 = jas_image_writecmpt(pjVar5,uVar12 & 0xffffffff,0,0,lVar2,lVar1);
        uVar12 = uVar12 + 1;
      } while (iVar3 == 0);
      __ptr = "cannot write image component\n";
      auStack_110 = (undefined1  [8])0x1d;
      goto LAB_00102a79;
    }
    auStack_110 = (undefined1  [8])0x102960;
    pjVar6 = (jas_matrix_t *)jas_matrix_create(lVar1);
    diffdata[lVar4] = pjVar6;
    lVar4 = lVar4 + 1;
  } while (pjVar6 != (jas_matrix_t *)0x0);
  __ptr = "cannot create matrix\n";
  auStack_110 = (undefined1  [8])0x15;
LAB_00102a79:
  __size = auStack_110;
  auStack_110 = (undefined1  [8])0x102a82;
  fwrite(__ptr,(size_t)__size,1,_stderr);
  auStack_110 = (undefined1  [8])0x102a8a;
  jas_image_destroy(pjVar5);
  return (jas_image_t *)0x0;
}

Assistant:

jas_image_t *makediffimage(jas_matrix_t *origdata, jas_matrix_t *recondata)
{
	jas_image_t *diffimage;
	jas_matrix_t *diffdata[3];
	int i;
	jas_image_cmptparm_t compparms[3];
	jas_seqent_t a;
	jas_seqent_t b;

	diffimage = 0;
	const jas_matind_t width = jas_matrix_numcols(origdata);
	const jas_matind_t height = jas_matrix_numrows(origdata);

	for (i = 0; i < 3; ++i) {
		compparms[i].tlx = 0;
		compparms[i].tly = 0;
		compparms[i].hstep = 1;
		compparms[i].vstep = 1;
		compparms[i].width = width;
		compparms[i].height = height;
		compparms[i].prec = 8;
		compparms[i].sgnd = false;
	}
	if (!(diffimage = jas_image_create(3, compparms, JAS_CLRSPC_SRGB))) {
		fprintf(stderr, "cannot create image\n");
		goto error;
	}

	for (i = 0; i < 3; ++i) {
		if (!(diffdata[i] = jas_matrix_create(height, width))) {
			fprintf(stderr, "cannot create matrix\n");
			goto error;
		}
	}

	for (jas_matind_t j = 0; j < height; ++j) {
		for (jas_matind_t k = 0; k < width; ++k) {
			a = jas_matrix_get(origdata, j, k);
			b = jas_matrix_get(recondata, j, k);
			if (a > b) {
				jas_matrix_set(diffdata[0], j, k, 255);
				jas_matrix_set(diffdata[1], j, k, 0);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else if (a < b) {
				jas_matrix_set(diffdata[0], j, k, 0);
				jas_matrix_set(diffdata[1], j, k, 255);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else {
				jas_matrix_set(diffdata[0], j, k, a);
				jas_matrix_set(diffdata[1], j, k, a);
				jas_matrix_set(diffdata[2], j, k, a);
			}
		}
	}

	for (i = 0; i < 3; ++i) {
		if (jas_image_writecmpt(diffimage, i, 0, 0, width, height, diffdata[i])) {
			fprintf(stderr, "cannot write image component\n");
			goto error;
		}
	}

	return diffimage;

error:
	if (diffimage) {
		jas_image_destroy(diffimage);
	}
	return 0;
}